

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int get_request(curl_socket_t sock,httprequest *req)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  unsigned_short uVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  uint *puVar10;
  ulong uVar11;
  char *pcVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  byte *pbVar16;
  byte *pbVar17;
  size_t sVar18;
  bool bVar19;
  int prot_minor;
  int prot_major;
  char *ptr;
  char *endp;
  char logbuf [456];
  char *local_218;
  uint local_210;
  uint local_20c;
  char *local_208;
  byte *local_200;
  char local_1f8 [456];
  
  pcVar12 = (char *)0x0;
  sVar18 = 0;
  if (req->pipelining == true) {
    pcVar12 = req->reqbuf + req->checkindex;
    sVar18 = req->offset - req->checkindex;
    req->pipelining = false;
    req->checkindex = 0;
    req->offset = 0;
  }
  uVar2 = req->offset;
  pcVar15 = "Request would overflow buffer, closing connection";
  if (uVar2 < 149999) {
    if (pcVar12 == (char *)0x0 || sVar18 == 0) {
      if (req->skip == 0) {
        sVar8 = 149999 - uVar2;
      }
      else {
        sVar8 = req->cl;
      }
      lVar7 = recv(sock,req->reqbuf + uVar2,sVar8,0);
    }
    else {
      memmove(req,pcVar12,sVar18);
      lVar7 = curlx_uztosz(sVar18);
    }
    if (got_exit_signal != 0) {
      return -1;
    }
    if (lVar7 == 0) {
      logmsg("Connection closed by client");
LAB_00106720:
      req->reqbuf[req->offset] = '\0';
      storerequest(req->reqbuf,req->offset);
      return -1;
    }
    if (lVar7 < 0) {
      puVar10 = (uint *)__errno_location();
      uVar1 = *puVar10;
      if (uVar1 == 0xb) {
        return 0;
      }
      pcVar12 = strerror(uVar1);
      logmsg("recv() returned error: (%d) %s",(ulong)uVar1,pcVar12);
      goto LAB_00106720;
    }
    logmsg("Read %zd bytes",lVar7);
    sVar18 = lVar7 + req->offset;
    req->offset = sVar18;
    req->reqbuf[sVar18] = '\0';
    pcVar12 = req->reqbuf + req->checkindex;
    pcVar15 = strstr(pcVar12,end_of_headers);
    iVar6 = req->callcount;
    req->callcount = iVar6 + 1;
    pcVar14 = "";
    if (0 < iVar6) {
      pcVar14 = " [CONTINUED]";
    }
    logmsg("Process %d bytes request%s",req->offset,pcVar14);
    if (((use_gopher == '\x01') && (req->testno == -4)) &&
       (iVar6 = strncmp("/verifiedserver",pcVar12,0xf), iVar6 == 0)) {
      logmsg("Are-we-friendly question received");
      req->testno = -2;
LAB_0010722e:
      bVar19 = true;
    }
    else {
      if ((req->testno == -4) &&
         (iVar6 = __isoc99_sscanf(pcVar12,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                  &ProcessRequest_doc,&local_20c,&local_210), uVar3 = local_20c,
         uVar1 = local_210, iVar6 == 4)) {
        uVar11 = (ulong)local_210;
        req->prot_version = local_210 + local_20c * 10;
        pcVar14 = strrchr(&ProcessRequest_doc,0x2f);
        local_208 = pcVar14;
        if (pcVar14 != (char *)0x0) {
          sVar8 = strlen(&ProcessRequest_doc);
          sVar9 = strlen(ProcessRequest_request);
          if (sVar9 + sVar8 < 400) {
            curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request,
                           &ProcessRequest_doc,(ulong)uVar3,uVar1);
          }
          else {
            curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",(ulong)uVar3,uVar11);
          }
          logmsg("%s",local_1f8);
          iVar6 = strncmp("/verifiedserver",pcVar14,0xf);
          if (iVar6 == 0) {
            lVar7 = -2;
            pcVar12 = "Are-we-friendly question received";
          }
          else {
            iVar6 = strncmp("/quit",pcVar14,5);
            if (iVar6 != 0) {
              do {
                pcVar14 = pcVar14 + 1;
                if (*pcVar14 == 0) break;
                iVar6 = Curl_isdigit((uint)(byte)*pcVar14);
              } while (iVar6 == 0);
              local_208 = pcVar14;
              uVar11 = strtol(pcVar14,&local_208,10);
              req->testno = uVar11;
              if ((long)uVar11 < 0x2711) {
                req->partno = 0;
              }
              else {
                req->partno = uVar11 % 10000;
                req->testno = uVar11 / 10000;
              }
              if (req->testno == 0) {
                req->testno = -4;
              }
              else {
                curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",req->testno,
                               req->partno);
                logmsg("%s",local_1f8);
                parse_servercmd(req);
              }
              goto LAB_001068cc;
            }
            lVar7 = -3;
            pcVar12 = "Request-to-quit received";
          }
          logmsg(pcVar12);
          req->testno = lVar7;
          goto LAB_0010722e;
        }
LAB_001068cc:
        if ((req->testno == -4) &&
           (iVar6 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,&local_20c
                                    ,&local_210), iVar6 == 3)) {
          curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                         &ProcessRequest_doc,(ulong)local_20c,(ulong)local_210);
          logmsg("%s");
          req->connect_request = true;
          if (req->prot_version == 10) {
            req->open = false;
          }
          if (ProcessRequest_doc == '[') {
            uVar11 = 0;
            pbVar17 = &DAT_0010e781;
            bVar4 = DAT_0010e781;
            while ((bVar4 != 0 &&
                   (((iVar6 = Curl_isxdigit((uint)bVar4), iVar6 != 0 || (*pbVar17 == 0x3a)) ||
                    (*pbVar17 == 0x2e))))) {
              uVar11 = strtoul((char *)pbVar17,(char **)&local_200,0x10);
              iVar6 = Curl_isxdigit((uint)*pbVar17);
              pbVar16 = local_200;
              if (iVar6 == 0) {
                pbVar16 = pbVar17 + 1;
              }
              bVar4 = *pbVar16;
              pbVar17 = pbVar16;
            }
            if (*pbVar17 == 0x5d) {
              if (pbVar17[1] != 0x3a) {
                pcVar14 = "Invalid CONNECT IPv6 port format";
                goto LAB_00106a00;
              }
              pbVar17 = pbVar17 + 1;
            }
            else {
              pcVar14 = "Invalid CONNECT IPv6 address format";
LAB_00106a00:
              pbVar17 = (byte *)0x0;
              logmsg(pcVar14);
            }
            req->testno = uVar11;
          }
          else {
            pbVar17 = (byte *)strchr(&ProcessRequest_doc,0x3a);
          }
          if (((pbVar17 != (byte *)0x0) && (pbVar17[1] != 0)) &&
             (iVar6 = Curl_isdigit((uint)pbVar17[1]), iVar6 != 0)) {
            uVar11 = strtoul((char *)(pbVar17 + 1),(char **)0x0,10);
            if (uVar11 - 0x10000 < 0xffffffffffff0001) {
              logmsg("Invalid CONNECT port received");
            }
            else {
              uVar5 = curlx_ultous(uVar11);
              req->connect_port = uVar5;
            }
          }
          logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno);
        }
        if ((req->testno == -4) && (pcVar14 = strstr(pcVar12,"\nTestno: "), pcVar14 != (char *)0x0))
        {
          lVar7 = strtol(pcVar14 + 9,(char **)0x0,10);
          req->testno = lVar7;
          logmsg("Found test number %d in Testno: header!",lVar7);
        }
        if (req->testno == -4) {
          local_208 = strrchr(&ProcessRequest_doc,0x2e);
          if (local_208 != (char *)0x0) {
            local_208 = local_208 + 1;
            uVar11 = strtol(local_208,&local_208,10);
            req->testno = uVar11;
            if ((long)uVar11 < 0x2711) {
              req->partno = 0;
            }
            else {
              req->partno = uVar11 % 10000;
              req->testno = uVar11 / 10000;
              logmsg("found test %d in requested host name",uVar11 / 10000);
            }
            curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld (from host name)",
                           req->testno,req->partno);
            logmsg("%s",local_1f8);
          }
          if (req->testno == 0) {
            logmsg("Did not find test number in PATH");
            req->testno = -1;
          }
          else {
            parse_servercmd(req);
          }
        }
      }
      else if ((2 < req->offset) && (req->testno == -4)) {
        logmsg("** Unusual request. Starts with %02x %02x %02x",(ulong)(uint)(int)*pcVar12,
               (ulong)(uint)(int)pcVar12[1],(ulong)(uint)(int)pcVar12[2]);
      }
      if (pcVar15 != (char *)0x0) {
        logmsg("- request found to be complete");
        if ((use_gopher == '\x01') &&
           (pcVar14 = strrchr(pcVar12,0x2f), local_208 = pcVar14, pcVar14 != (char *)0x0)) {
          do {
            pcVar14 = pcVar14 + 1;
            if (*pcVar14 == 0) break;
            iVar6 = Curl_isdigit((uint)(byte)*pcVar14);
          } while (iVar6 == 0);
          local_208 = pcVar14;
          uVar11 = strtol(pcVar14,&local_208,10);
          req->testno = uVar11;
          if ((long)uVar11 < 0x2711) {
            req->partno = 0;
          }
          else {
            req->partno = uVar11 % 10000;
            req->testno = uVar11 / 10000;
          }
          curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld",req->testno,
                         req->partno);
          logmsg("%s",local_1f8);
        }
        if (req->pipe != 0) {
          sVar8 = strlen(end_of_headers);
          req->checkindex = (size_t)(pcVar15 + req->checkindex + (sVar8 - (long)pcVar12));
        }
        bVar19 = false;
LAB_00106d32:
        if (got_exit_signal != 0) goto LAB_0010722e;
        if ((req->cl != 0) ||
           (iVar6 = Curl_strncasecompare("Content-Length:",pcVar12,0xf), iVar6 == 0)) {
          iVar6 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar12,0x1a);
          if (iVar6 != 0) {
            bVar19 = true;
          }
          if (!bVar19) goto code_r0x00106d85;
          pcVar12 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
          bVar19 = pcVar12 != (char *)0x0;
          goto LAB_00107231;
        }
        bVar4 = pcVar12[0xf];
        pcVar12 = pcVar12 + 0xf;
        while ((bVar4 != 0 && (iVar6 = Curl_isspace((uint)bVar4), iVar6 != 0))) {
          bVar4 = pcVar12[1];
          pcVar12 = pcVar12 + 1;
        }
        local_208 = pcVar12;
        piVar13 = __errno_location();
        *piVar13 = 0;
        uVar11 = strtoul(pcVar12,&local_208,10);
        if (((pcVar12 == local_208) || (iVar6 = Curl_isspace((uint)(byte)*local_208), iVar6 == 0))
           || (*piVar13 == 0x22)) {
          logmsg("Found invalid Content-Length: (%s) in the request",pcVar12);
          req->open = false;
          goto LAB_0010722e;
        }
        req->cl = uVar11 - (long)req->skip;
        logmsg("Found Content-Length: %lu in the request",uVar11);
        if (req->skip != 0) {
          logmsg("... but will abort after %zu bytes",req->cl);
        }
LAB_00106d9f:
        if (((req->auth == false) &&
            (pcVar12 = strstr(req->reqbuf,"Authorization:"), pcVar12 != (char *)0x0)) &&
           (req->auth = true, req->auth_req == true)) {
          logmsg("Authorization header found, as required");
        }
        pcVar12 = strstr(req->reqbuf,"Authorization: Negotiate");
        if (pcVar12 == (char *)0x0) {
          if ((req->digest == false) &&
             (pcVar12 = strstr(req->reqbuf,"Authorization: Digest"), pcVar12 != (char *)0x0)) {
            sVar18 = req->partno + 1000;
            req->partno = sVar18;
            req->digest = true;
            pcVar12 = "Received Digest request, sending back data %ld";
          }
          else if (req->ntlm == false) {
            pcVar12 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
            if (pcVar12 == (char *)0x0) {
              pcVar12 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
              if (pcVar12 == (char *)0x0) goto LAB_00106ee8;
              sVar18 = req->partno + 0x3e9;
              req->partno = sVar18;
              req->ntlm = true;
              pcVar12 = "Received NTLM type-1, sending back data %ld";
            }
            else {
              req->partno = req->partno + 0x3ea;
              req->ntlm = true;
              logmsg("Received NTLM type-3, sending back data %ld");
              sVar18 = req->cl;
              if (sVar18 == 0) goto LAB_0010707b;
              pcVar12 = "  Expecting %zu POSTed bytes";
            }
          }
          else {
LAB_00106ee8:
            lVar7 = req->partno;
            if ((lVar7 < 1000) ||
               (pcVar12 = strstr(req->reqbuf,"Authorization: Basic"), pcVar12 == (char *)0x0))
            goto LAB_0010707b;
            sVar18 = lVar7 + 1;
            req->partno = sVar18;
            pcVar12 = "Received Basic request, sending back data %ld";
          }
          logmsg(pcVar12,sVar18);
        }
        else {
          logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                 ProcessRequest_prev_partno);
          if (req->testno != ProcessRequest_prev_testno) {
            ProcessRequest_prev_partno = req->partno;
            ProcessRequest_prev_testno = req->testno;
          }
          ProcessRequest_prev_partno = ProcessRequest_prev_partno + 1;
          req->partno = ProcessRequest_prev_partno;
        }
LAB_0010707b:
        pcVar12 = strstr(req->reqbuf,"Connection: close");
        if (pcVar12 != (char *)0x0) {
          req->open = false;
        }
        pcVar12 = end_of_headers;
        iVar6 = req->pipe;
        if (iVar6 == 0) {
          if (((((req->open == true) && (10 < req->prot_version)) &&
               (sVar18 = req->offset, sVar8 = strlen(end_of_headers),
               pcVar15 + sVar8 < req->reqbuf + sVar18)) && (req->cl == 0)) &&
             ((iVar6 = strncmp(req->reqbuf,"GET",3), iVar6 == 0 ||
              (iVar6 = strncmp(req->reqbuf,"HEAD",4), iVar6 == 0)))) {
            req->checkindex = (size_t)(pcVar15 + (sVar8 - (long)req));
            req->pipelining = true;
          }
        }
        else {
          local_218 = (char *)0x0;
          do {
            iVar6 = iVar6 + -1;
            if (got_exit_signal != 0) goto LAB_0010722e;
            sVar18 = req->checkindex;
            pcVar14 = strstr(req->reqbuf + sVar18,pcVar12);
            pcVar15 = local_218;
            if (pcVar14 == (char *)0x0) break;
            sVar8 = strlen(pcVar12);
            req->checkindex = (size_t)(pcVar14 + sVar8 + (sVar18 - (long)(req->reqbuf + sVar18)));
            req->pipe = iVar6;
            pcVar15 = pcVar14;
          } while (iVar6 != 0);
        }
        local_218 = pcVar15;
        if ((req->auth_req == true) && (req->auth == false)) {
          logmsg("Return early due to auth requested by none provided");
          goto LAB_0010722e;
        }
        if ((req->upgrade == true) &&
           (pcVar12 = strstr(req->reqbuf,"Upgrade:"), pcVar12 != (char *)0x0)) {
          logmsg("Found Upgrade: in request and allows it");
          req->upgrade_request = true;
        }
        uVar11 = req->cl;
        bVar19 = true;
        if (uVar11 != 0) {
          sVar18 = req->offset;
          sVar8 = strlen(end_of_headers);
          bVar19 = uVar11 <= (long)req + (sVar18 - (long)(local_218 + sVar8));
        }
        goto LAB_00107231;
      }
      bVar19 = false;
      logmsg("request not complete yet");
    }
LAB_00107231:
    req->done_processing = (uint)bVar19;
    if (got_exit_signal != 0) {
      return -1;
    }
    if ((bVar19 != false) && (req->pipe != 0)) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe = req->pipe + -1;
    }
    pcVar15 = "Request would overflow buffer, closing connection";
    if ((uVar2 < 149999) && (uVar11 = req->offset, 0x249ee < uVar2 || uVar11 != 149999)) {
      bVar19 = true;
      if (uVar11 < 150000) goto LAB_001072c8;
      pcVar15 = "Request buffer overflow, closing connection";
    }
  }
  bVar19 = false;
  logmsg(pcVar15);
  uVar11 = 149999;
LAB_001072c8:
  req->reqbuf[uVar11] = '\0';
  if ((!bVar19) || (req->done_processing != 0)) {
    storerequest(req->reqbuf,(&req->checkindex)[req->pipelining ^ 1]);
  }
  return -(uint)(byte)(~bVar19 | got_exit_signal != 0) | 1;
code_r0x00106d85:
  pcVar14 = strchr(pcVar12,10);
  pcVar12 = pcVar14 + 1;
  if (pcVar14 == (char *)0x0) goto LAB_00106d9f;
  goto LAB_00106d32;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int error;
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}